

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qregion.cpp
# Opt level: O1

void loadAET(EdgeTableEntry *AET,EdgeTableEntry *ETEs)

{
  EdgeTableEntry *pEVar1;
  EdgeTableEntry *pEVar2;
  EdgeTableEntry *pEVar3;
  EdgeTableEntry *pPrevAET;
  bool bVar4;
  
  if (ETEs != (EdgeTableEntry *)0x0) {
    pEVar2 = AET->next;
    do {
      pEVar3 = ETEs;
      bVar4 = pEVar2 == (EdgeTableEntry *)0x0;
      if (!bVar4) {
        do {
          pEVar1 = pEVar2;
          pEVar2 = pEVar1;
          if ((pEVar3->bres).minor_axis <= (pEVar1->bres).minor_axis) break;
          pEVar2 = pEVar1->next;
          bVar4 = pEVar2 == (EdgeTableEntry *)0x0;
          AET = pEVar1;
        } while (!bVar4);
      }
      ETEs = pEVar3->next;
      pEVar3->next = pEVar2;
      if (!bVar4) {
        pEVar2->back = pEVar3;
      }
      pEVar3->back = AET;
      AET->next = pEVar3;
      AET = pEVar3;
    } while (ETEs != (_EdgeTableEntry *)0x0);
  }
  return;
}

Assistant:

static void loadAET(EdgeTableEntry *AET, EdgeTableEntry *ETEs)
{
    EdgeTableEntry *pPrevAET;
    EdgeTableEntry *tmp;

    pPrevAET = AET;
    AET = AET->next;
    while (ETEs) {
        while (AET && AET->bres.minor_axis < ETEs->bres.minor_axis) {
            pPrevAET = AET;
            AET = AET->next;
        }
        tmp = ETEs->next;
        ETEs->next = AET;
        if (AET)
            AET->back = ETEs;
        ETEs->back = pPrevAET;
        pPrevAET->next = ETEs;
        pPrevAET = ETEs;

        ETEs = tmp;
    }
}